

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall pbrt::syntactic::Scene::~Scene(Scene *this)

{
  __shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  this->_vptr_Scene = (_func_int **)&PTR__Scene_001671a0;
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->world).super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>,
             &local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  std::__cxx11::string::~string((string *)&this->basePath);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->world).super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->pixelFilter).
              super___shared_ptr<pbrt::syntactic::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->surfaceIntegrator).
              super___shared_ptr<pbrt::syntactic::SurfaceIntegrator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->volumeIntegrator).
              super___shared_ptr<pbrt::syntactic::VolumeIntegrator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->integrator).
              super___shared_ptr<pbrt::syntactic::Integrator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->sampler).
              super___shared_ptr<pbrt::syntactic::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->film).super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  ::~vector(&this->cameras);
  return;
}

Assistant:

virtual ~Scene()
      {
        world = nullptr;
      }